

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ESOINN.cpp
# Opt level: O0

void __thiscall soinn::ESOINN::markAdjacentVertices(ESOINN *this,Vertex *vertex,int cID)

{
  double dVar1;
  type_conflict1 tVar2;
  reference pvVar3;
  vertex_bundled *pvVar4;
  adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>,_boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>::config,_boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>,_boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>::config>_>
  *in_RCX;
  type local_b0;
  reference local_98;
  Vertex v;
  pair<boost::adjacency_iterator<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>,_void_*,_boost::detail::out_edge_iter<std::_List_iterator<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_soinn::EdgeProperties>_>,_soinn::EdgeProperties>_>,_void_*,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_long>,_boost::adjacency_iterator<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>,_void_*,_boost::detail::out_edge_iter<std::_List_iterator<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_soinn::EdgeProperties>_>,_soinn::EdgeProperties>_>,_void_*,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_long>_>
  local_80;
  undefined1 local_50 [8];
  AdjacencyIterator end;
  AdjacencyIterator current;
  int cID_local;
  Vertex *vertex_local;
  ESOINN *this_local;
  
  boost::
  adjacency_iterator<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>,_void_*,_boost::detail::out_edge_iter<std::_List_iterator<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_soinn::EdgeProperties>_>,_soinn::EdgeProperties>_>,_void_*,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_long>
  ::adjacency_iterator
            ((adjacency_iterator<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>,_void_*,_boost::detail::out_edge_iter<std::_List_iterator<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_soinn::EdgeProperties>_>,_soinn::EdgeProperties>_>,_void_*,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_long>
              *)&end.m_g);
  boost::
  adjacency_iterator<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>,_void_*,_boost::detail::out_edge_iter<std::_List_iterator<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_soinn::EdgeProperties>_>,_soinn::EdgeProperties>_>,_void_*,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_long>
  ::adjacency_iterator
            ((adjacency_iterator<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>,_void_*,_boost::detail::out_edge_iter<std::_List_iterator<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_soinn::EdgeProperties>_>,_soinn::EdgeProperties>_>,_void_*,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_long>
              *)local_50);
  boost::
  adjacent_vertices<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>,boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>,boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>::config>>
            (&local_80,(boost *)*vertex,&this->graph,in_RCX);
  boost::tuples::
  tie<boost::adjacency_iterator<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>,void*,boost::detail::out_edge_iter<std::_List_iterator<boost::detail::stored_edge_iter<void*,std::_List_iterator<boost::list_edge<void*,soinn::EdgeProperties>>,soinn::EdgeProperties>>,void*,boost::detail::edge_desc_impl<boost::undirected_tag,void*>,long>,long>,boost::adjacency_iterator<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>,void*,boost::detail::out_edge_iter<std::_List_iterator<boost::detail::stored_edge_iter<void*,std::_List_iterator<boost::list_edge<void*,soinn::EdgeProperties>>,soinn::EdgeProperties>>,void*,boost::detail::edge_desc_impl<boost::undirected_tag,void*>,long>,long>>
            ((tuples *)&v,
             (adjacency_iterator<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>,_void_*,_boost::detail::out_edge_iter<std::_List_iterator<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_soinn::EdgeProperties>_>,_soinn::EdgeProperties>_>,_void_*,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_long>
              *)&end.m_g,
             (adjacency_iterator<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>,_void_*,_boost::detail::out_edge_iter<std::_List_iterator<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_soinn::EdgeProperties>_>,_soinn::EdgeProperties>_>,_void_*,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_long>
              *)local_50);
  boost::tuples::
  tuple<boost::adjacency_iterator<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>,void*,boost::detail::out_edge_iter<std::_List_iterator<boost::detail::stored_edge_iter<void*,std::_List_iterator<boost::list_edge<void*,soinn::EdgeProperties>>,soinn::EdgeProperties>>,void*,boost::detail::edge_desc_impl<boost::undirected_tag,void*>,long>,long>&,boost::adjacency_iterator<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>,void*,boost::detail::out_edge_iter<std::_List_iterator<boost::detail::stored_edge_iter<void*,std::_List_iterator<boost::list_edge<void*,soinn::EdgeProperties>>,soinn::EdgeProperties>>,void*,boost::detail::edge_desc_impl<boost::undirected_tag,void*>,long>,long>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
  ::operator=((tuple<boost::adjacency_iterator<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>,void*,boost::detail::out_edge_iter<std::_List_iterator<boost::detail::stored_edge_iter<void*,std::_List_iterator<boost::list_edge<void*,soinn::EdgeProperties>>,soinn::EdgeProperties>>,void*,boost::detail::edge_desc_impl<boost::undirected_tag,void*>,long>,long>&,boost::adjacency_iterator<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>,void*,boost::detail::out_edge_iter<std::_List_iterator<boost::detail::stored_edge_iter<void*,std::_List_iterator<boost::list_edge<void*,soinn::EdgeProperties>>,soinn::EdgeProperties>>,void*,boost::detail::edge_desc_impl<boost::undirected_tag,void*>,long>,long>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
               *)&v,&local_80);
  while( true ) {
    tVar2 = boost::iterators::operator!=
                      ((iterator_facade<boost::adjacency_iterator<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>,_void_*,_boost::detail::out_edge_iter<std::_List_iterator<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_soinn::EdgeProperties>_>,_soinn::EdgeProperties>_>,_void_*,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_long>,_void_*,_boost::iterators::detail::iterator_category_with_traversal<std::input_iterator_tag,_boost::iterators::bidirectional_traversal_tag>,_void_*,_long>
                        *)&end.m_g,
                       (iterator_facade<boost::adjacency_iterator<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>,_void_*,_boost::detail::out_edge_iter<std::_List_iterator<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_soinn::EdgeProperties>_>,_soinn::EdgeProperties>_>,_void_*,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_long>,_void_*,_boost::iterators::detail::iterator_category_with_traversal<std::input_iterator_tag,_boost::iterators::bidirectional_traversal_tag>,_void_*,_long>
                        *)local_50);
    if (!tVar2) break;
    pvVar3 = boost::iterators::detail::
             iterator_facade_base<boost::adjacency_iterator<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>,_void_*,_boost::detail::out_edge_iter<std::_List_iterator<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_soinn::EdgeProperties>_>,_soinn::EdgeProperties>_>,_void_*,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_long>,_void_*,_boost::iterators::detail::iterator_category_with_traversal<std::input_iterator_tag,_boost::iterators::bidirectional_traversal_tag>,_void_*,_long,_false,_false>
             ::operator*((iterator_facade_base<boost::adjacency_iterator<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>,_void_*,_boost::detail::out_edge_iter<std::_List_iterator<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_soinn::EdgeProperties>_>,_soinn::EdgeProperties>_>,_void_*,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_long>,_void_*,_boost::iterators::detail::iterator_category_with_traversal<std::input_iterator_tag,_boost::iterators::bidirectional_traversal_tag>,_void_*,_long,_false,_false>
                          *)&end.m_g);
    pvVar4 = boost::
             adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>
             ::operator[](&this->graph,pvVar3);
    if (pvVar4->classId == -1) {
      pvVar3 = boost::iterators::detail::
               iterator_facade_base<boost::adjacency_iterator<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>,_void_*,_boost::detail::out_edge_iter<std::_List_iterator<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_soinn::EdgeProperties>_>,_soinn::EdgeProperties>_>,_void_*,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_long>,_void_*,_boost::iterators::detail::iterator_category_with_traversal<std::input_iterator_tag,_boost::iterators::bidirectional_traversal_tag>,_void_*,_long,_false,_false>
               ::operator*((iterator_facade_base<boost::adjacency_iterator<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>,_void_*,_boost::detail::out_edge_iter<std::_List_iterator<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_soinn::EdgeProperties>_>,_soinn::EdgeProperties>_>,_void_*,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_long>,_void_*,_boost::iterators::detail::iterator_category_with_traversal<std::input_iterator_tag,_boost::iterators::bidirectional_traversal_tag>,_void_*,_long,_false,_false>
                            *)&end.m_g);
      pvVar4 = boost::
               adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>
               ::operator[](&this->graph,pvVar3);
      dVar1 = pvVar4->density;
      pvVar4 = boost::
               adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>
               ::operator[](&this->graph,*vertex);
      if (dVar1 < pvVar4->density) {
        pvVar3 = boost::iterators::detail::
                 iterator_facade_base<boost::adjacency_iterator<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>,_void_*,_boost::detail::out_edge_iter<std::_List_iterator<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_soinn::EdgeProperties>_>,_soinn::EdgeProperties>_>,_void_*,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_long>,_void_*,_boost::iterators::detail::iterator_category_with_traversal<std::input_iterator_tag,_boost::iterators::bidirectional_traversal_tag>,_void_*,_long,_false,_false>
                 ::operator*((iterator_facade_base<boost::adjacency_iterator<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>,_void_*,_boost::detail::out_edge_iter<std::_List_iterator<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_soinn::EdgeProperties>_>,_soinn::EdgeProperties>_>,_void_*,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_long>,_void_*,_boost::iterators::detail::iterator_category_with_traversal<std::input_iterator_tag,_boost::iterators::bidirectional_traversal_tag>,_void_*,_long,_false,_false>
                              *)&end.m_g);
        pvVar4 = boost::
                 adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>
                 ::operator[](&this->graph,pvVar3);
        pvVar4->classId = cID;
        local_98 = boost::iterators::detail::
                   iterator_facade_base<boost::adjacency_iterator<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>,_void_*,_boost::detail::out_edge_iter<std::_List_iterator<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_soinn::EdgeProperties>_>,_soinn::EdgeProperties>_>,_void_*,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_long>,_void_*,_boost::iterators::detail::iterator_category_with_traversal<std::input_iterator_tag,_boost::iterators::bidirectional_traversal_tag>,_void_*,_long,_false,_false>
                   ::operator*((iterator_facade_base<boost::adjacency_iterator<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>,_void_*,_boost::detail::out_edge_iter<std::_List_iterator<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_soinn::EdgeProperties>_>,_soinn::EdgeProperties>_>,_void_*,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_long>,_void_*,_boost::iterators::detail::iterator_category_with_traversal<std::input_iterator_tag,_boost::iterators::bidirectional_traversal_tag>,_void_*,_long,_false,_false>
                                *)&end.m_g);
        markAdjacentVertices(this,&local_98,cID);
      }
    }
    boost::iterators::operator++
              (&local_b0,
               (iterator_facade<boost::adjacency_iterator<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>,_void_*,_boost::detail::out_edge_iter<std::_List_iterator<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_soinn::EdgeProperties>_>,_soinn::EdgeProperties>_>,_void_*,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_long>,_void_*,_boost::iterators::detail::iterator_category_with_traversal<std::input_iterator_tag,_boost::iterators::bidirectional_traversal_tag>,_void_*,_long>
                *)&end.m_g,0);
  }
  return;
}

Assistant:

void ESOINN::markAdjacentVertices(Vertex &vertex, int cID)
{
    AdjacencyIterator current, end;
    boost::tie(current, end) = boost::adjacent_vertices(vertex, graph);
    for(; current != end; current++){
        if(graph[*current].classId == -1 && graph[*current].density < graph[vertex].density)
        {
            graph[*current].classId = cID;
            Vertex v = *current;
            markAdjacentVertices(v, cID);
        }
    }
}